

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

gnode_t * parse_macro_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *pgVar1;
  gravity_delegate_t *pgVar2;
  lexer_r *plVar3;
  size_t sVar4;
  gtoken_s token_00;
  gravity_class_t *pgVar5;
  gnode_t *ast;
  gnode_t *ast_00;
  _Bool _Var6;
  gtoken_t gVar7;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  gnode_t *extraout_RAX;
  char *pcVar11;
  gnode_t *pgVar12;
  gnode_t *extraout_RAX_00;
  undefined7 extraout_var;
  undefined4 extraout_var_01;
  gnode_t *extraout_RAX_01;
  gravity_lexer_t **ppgVar13;
  gnode_t *extraout_RAX_02;
  undefined7 extraout_var_00;
  gravity_class_t **ppgVar14;
  gnode_t *extraout_RAX_03;
  gnode_t *extraout_RAX_04;
  gnode_t *extraout_RAX_05;
  gnode_t *extraout_RAX_06;
  gnode_t *extraout_RAX_07;
  gnode_t *extraout_RAX_08;
  gnode_t *extraout_RAX_09;
  char *pcVar15;
  char cVar16;
  error_type_t eVar17;
  size_t sVar18;
  gravity_lexer_t *pgVar19;
  gnode_t *pgVar20;
  uint32_t uVar21;
  bool bVar22;
  gravity_value_t v;
  uint32_t fileid;
  size_t size;
  gtoken_s token;
  char buffer [1024];
  _Bool local_8f9;
  gnode_t *local_8f8;
  gnode_t *local_8f0;
  gnode_t *local_8e8;
  gnode_t *local_8e0;
  uint32_t local_8d4;
  gnode_t *local_8d0;
  char *local_8c8;
  gnode_t *local_8c0;
  size_t local_8b8 [6];
  undefined4 local_888 [20];
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  char *local_818;
  uint32_t local_438;
  undefined4 uStack_434;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  char *local_418;
  
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  gVar7 = gravity_lexer_next(pgVar1);
  if (gVar7 != TOK_MACRO) {
    __assert_fail("type == TOK_MACRO",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x96f,"gnode_t *parse_macro_statement(gravity_parser_t *)");
  }
  gVar7 = gravity_lexer_peek(pgVar1);
  if ((gVar7 == TOK_OP_NOT) && (uVar8 = gravity_lexer_lineno(pgVar1), uVar8 == 1)) {
    gVar7 = gravity_lexer_next(pgVar1);
    if (gVar7 == TOK_OP_NOT) {
      gravity_lexer_skip_line(pgVar1);
      return extraout_RAX;
    }
    __assert_fail("type == TOK_OP_NOT",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x976,"gnode_t *parse_macro_statement(gravity_parser_t *)");
  }
  pcVar11 = parse_identifier(parser);
  if (pcVar11 == (char *)0x0) {
LAB_0011c7f7:
    gravity_lexer_token(pgVar1);
    pcVar15 = "%s";
    pcVar11 = "Unknown macro token. Declaration will be ignored.";
    eVar17 = GRAVITY_WARNING;
LAB_0011c83b:
    report_error(parser,eVar17,pcVar15,pcVar11);
    return extraout_RAX_01;
  }
  iVar9 = string_cmp(pcVar11,"unittest");
  if (iVar9 == 0) {
    iVar9 = 1;
  }
  else {
    iVar9 = string_cmp(pcVar11,"include");
    if (iVar9 == 0) {
      iVar9 = 2;
    }
    else {
      iVar9 = string_cmp(pcVar11,"push");
      if (iVar9 == 0) {
        iVar9 = 3;
      }
      else {
        iVar9 = string_cmp(pcVar11,"pop");
        iVar9 = (uint)(iVar9 == 0) << 2;
      }
    }
  }
  free(pcVar11);
  gravity_lexer_token(pgVar1);
  local_888[0] = 7;
  pgVar2 = parser->delegate;
  if ((pgVar2 != (gravity_delegate_t *)0x0) &&
     (pgVar2->parser_callback != (gravity_parser_callback)0x0)) {
    (*pgVar2->parser_callback)(local_888,pgVar2->xdata);
  }
  if (iVar9 == 2) {
    pgVar1 = parser->lexer->p[parser->lexer->n - 1];
    gVar7 = gravity_lexer_next(pgVar1);
    gravity_lexer_token(pgVar1);
    local_818 = local_418;
    local_838 = CONCAT44(uStack_434,local_438);
    local_828 = local_428;
    uStack_820 = uStack_420;
    uStack_830 = uStack_430;
    if (gVar7 == TOK_STRING) {
      do {
        if ((parser->delegate == (gravity_delegate_t *)0x0) ||
           (parser->delegate->loadfile_callback == (gravity_loadfile_callback)0x0)) {
          gravity_lexer_token(pgVar1);
          pcVar11 = "Unable to load file because no loadfile callback registered in delegate.";
          goto LAB_0011cb39;
        }
        local_438 = 0;
        token_00.colno = (int)uStack_430;
        token_00.type = (undefined4)local_838;
        token_00.lineno = local_838._4_4_;
        token_00.position = (int)((ulong)uStack_430 >> 0x20);
        token_00.bytes = (int)local_428;
        token_00.length = (int)((ulong)local_428 >> 0x20);
        token_00.fileid = (int)uStack_420;
        token_00.builtin = (int)((ulong)uStack_420 >> 0x20);
        token_00.value = local_418;
        pcVar11 = token_string(token_00,&local_438);
        pcVar15 = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(local_438 + 1));
        memcpy(pcVar15,pcVar11,(ulong)local_438);
        local_8b8[0] = 0;
        local_8d4 = 0;
        local_8f9 = false;
        pcVar11 = (*parser->delegate->loadfile_callback)
                            (pcVar15,local_8b8,&local_8d4,parser->delegate->xdata,&local_8f9);
        pgVar19 = (gravity_lexer_t *)0x0;
        if (pcVar11 != (char *)0x0) {
          pgVar19 = gravity_lexer_create(pcVar11,local_8b8[0],local_8d4,local_8f9);
        }
        if (pgVar19 == (gravity_lexer_t *)0x0) {
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x144bd7,pcVar15);
        }
        else {
          plVar3 = parser->lexer;
          sVar4 = plVar3->m;
          if (plVar3->n == sVar4) {
            sVar18 = sVar4 * 2;
            if (sVar4 == 0) {
              sVar18 = 8;
            }
            plVar3->m = sVar18;
            ppgVar13 = (gravity_lexer_t **)realloc(plVar3->p,sVar18 << 3);
            parser->lexer->p = ppgVar13;
          }
          plVar3 = parser->lexer;
          sVar4 = plVar3->n;
          plVar3->n = sVar4 + 1;
          plVar3->p[sVar4] = pgVar19;
        }
        if (pcVar15 != (char *)0x0) {
          free(pcVar15);
        }
        gVar7 = gravity_lexer_peek(pgVar1);
        if (gVar7 != TOK_OP_COMMA) {
          _Var6 = parse_semicolon(parser);
          return (gnode_t *)CONCAT71(extraout_var_00,_Var6);
        }
        gravity_lexer_next(pgVar1);
        gVar7 = gravity_lexer_next(pgVar1);
        gravity_lexer_token(pgVar1);
        local_818 = local_418;
        local_838 = CONCAT44(uStack_434,local_438);
        local_828 = local_428;
        uStack_820 = uStack_420;
        uStack_830 = uStack_430;
      } while (gVar7 == TOK_STRING);
    }
    pcVar11 = token_name(gVar7);
    pcVar15 = "Expected file name but found %s.";
    eVar17 = GRAVITY_ERROR_SYNTAX;
    goto LAB_0011c83b;
  }
  if (iVar9 != 1) goto LAB_0011c7f7;
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  if (parser->statements->n != 2) {
    gravity_lexer_token(pgVar1);
    pcVar11 = 
    "#unittest macro cannot be embedded in a statement (it must be the root of the document).";
LAB_0011cb39:
    report_error(parser,GRAVITY_ERROR_SYNTAX,pcVar11);
    return extraout_RAX_02;
  }
  parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
  local_8c0 = (gnode_t *)0x0;
  local_8f8 = (gnode_t *)0x0;
  local_8e0 = (gnode_t *)0x0;
  local_8e8 = (gnode_t *)0x0;
  local_8f0 = (gnode_t *)0x0;
  local_8d0 = (gnode_t *)0x0;
  while (gVar7 = gravity_lexer_peek(pgVar1), gVar7 != TOK_OP_CLOSED_CURLYBRACE) {
    pgVar12 = (gnode_t *)parse_identifier(parser);
    iVar9 = 4;
    if (pgVar12 != (gnode_t *)0x0) {
      parse_required(parser,TOK_OP_COLON);
      iVar10 = string_cmp((char *)pgVar12,"name");
      if (iVar10 == 0) {
        cVar16 = '\x01';
      }
      else {
        iVar10 = string_cmp((char *)pgVar12,"note");
        if (iVar10 == 0) {
          cVar16 = '\x06';
        }
        else {
          iVar10 = string_cmp((char *)pgVar12,"error");
          if (iVar10 == 0) {
            cVar16 = '\x02';
          }
          else {
            iVar10 = string_cmp((char *)pgVar12,"error_row");
            if (iVar10 == 0) {
              cVar16 = '\x04';
            }
            else {
              iVar10 = string_cmp((char *)pgVar12,"error_col");
              if (iVar10 == 0) {
                cVar16 = '\x05';
              }
              else {
                iVar10 = string_cmp((char *)pgVar12,"result");
                cVar16 = (iVar10 == 0) * '\x03';
              }
            }
          }
        }
      }
      free(pgVar12);
      switch(cVar16) {
      case '\x01':
        local_8d0 = parse_literal_expression(parser);
        if (local_8d0 == (gnode_t *)0x0) {
          local_8d0 = (gnode_t *)0x0;
          pgVar12 = (gnode_t *)0x0;
        }
        else {
LAB_0011c7bb:
          _Var6 = parse_semicolon(parser);
          pgVar12 = (gnode_t *)CONCAT71(extraout_var,_Var6);
          iVar9 = 0;
        }
        break;
      case '\x02':
        local_8e8 = parse_identifier_expression(parser);
        if (local_8e8 != (gnode_t *)0x0) goto LAB_0011c7bb;
        local_8e8 = (gnode_t *)0x0;
        pgVar12 = (gnode_t *)0x0;
        break;
      case '\x03':
        gVar7 = gravity_lexer_peek(pgVar1);
        if ((gVar7 & ~TOK_ERROR) == TOK_OP_ADD) {
          gVar7 = gravity_lexer_next(pgVar1);
          bVar22 = gVar7 != TOK_OP_SUB;
LAB_0011c74f:
          pgVar12 = parse_literal_expression(parser);
          iVar9 = (uint)(pgVar12 == (gnode_t *)0x0) << 2;
          if ((pgVar12 != (gnode_t *)0x0) && (!bVar22)) {
            iVar9 = 0;
            if (pgVar12[1].tag == NODE_COMPOUND_STAT) {
              *(ulong *)&pgVar12[1].block_length =
                   *(ulong *)&pgVar12[1].block_length ^ 0x8000000000000000;
            }
            else {
              iVar9 = 0;
              if (pgVar12[1].tag == NODE_LABEL_STAT) {
                *(long *)&pgVar12[1].block_length = -*(long *)&pgVar12[1].block_length;
              }
            }
          }
        }
        else {
          bVar22 = true;
          if (gVar7 != TOK_KEY_NULL) goto LAB_0011c74f;
          gravity_lexer_next(pgVar1);
          iVar9 = 5;
          pgVar12 = (gnode_t *)0x0;
        }
        local_8c0 = pgVar12;
        if ((iVar9 == 0) || (iVar9 == 5)) goto LAB_0011c7bb;
        break;
      case '\x04':
        local_8e0 = parse_literal_expression(parser);
        if (local_8e0 != (gnode_t *)0x0) goto LAB_0011c7bb;
        local_8e0 = (gnode_t *)0x0;
        pgVar12 = (gnode_t *)0x0;
        break;
      case '\x05':
        local_8f8 = parse_literal_expression(parser);
        if (local_8f8 != (gnode_t *)0x0) goto LAB_0011c7bb;
        local_8f8 = (gnode_t *)0x0;
        pgVar12 = (gnode_t *)0x0;
        break;
      case '\x06':
        local_8f0 = parse_literal_expression(parser);
        if (local_8f0 != (gnode_t *)0x0) goto LAB_0011c7bb;
        local_8f0 = (gnode_t *)0x0;
        pgVar12 = (gnode_t *)0x0;
        break;
      default:
        gravity_lexer_token(pgVar1);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x144afa);
        pgVar12 = extraout_RAX_00;
      }
    }
    if (iVar9 != 0) {
      if (iVar9 != 4) {
        return pgVar12;
      }
      pgVar1 = parser->lexer->p[parser->lexer->n - 1];
      do {
        gVar7 = gravity_lexer_next(pgVar1);
        if (gVar7 == TOK_OP_CLOSED_CURLYBRACE) {
          return (gnode_t *)CONCAT44(extraout_var_01,gVar7);
        }
      } while (gVar7 != TOK_EOF);
      return (gnode_t *)CONCAT44(extraout_var_01,gVar7);
    }
  }
  parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
  parse_semicolon(parser);
  pgVar12 = local_8e8;
  pgVar5 = gravity_class_null;
  pgVar20 = local_8f8;
  if (local_8d0 == (gnode_t *)0x0) {
    local_8c8 = (char *)0x0;
  }
  else if (local_8d0[1].tag == NODE_LIST_STAT) {
    local_8c8 = (char *)&local_838;
    snprintf(local_8c8,0x400,"%.*s",(ulong)local_8d0[1].refcount,
             *(undefined8 *)&local_8d0[1].block_length);
    pgVar20 = local_8f8;
  }
  else {
    local_8c8 = (char *)0x0;
  }
  if ((local_8f0 == (gnode_t *)0x0) || (local_8f0[1].tag != NODE_LIST_STAT)) {
    local_8f8 = (gnode_t *)0x0;
  }
  else {
    local_8f8 = (gnode_t *)&local_438;
    snprintf((char *)local_8f8,0x400,"%.*s",(ulong)local_8f0[1].refcount,
             *(undefined8 *)&local_8f0[1].block_length);
  }
  eVar17 = GRAVITY_ERROR_NONE;
  if ((pgVar12 != (gnode_t *)0x0) &&
     (iVar9 = string_cmp(*(char **)(pgVar12 + 1),"NONE"), eVar17 = GRAVITY_ERROR_NONE, iVar9 != 0))
  {
    iVar9 = string_cmp(*(char **)(pgVar12 + 1),"SYNTAX");
    if (iVar9 == 0) {
      eVar17 = GRAVITY_ERROR_SYNTAX;
    }
    else {
      iVar9 = string_cmp(*(char **)(pgVar12 + 1),"SEMANTIC");
      if (iVar9 == 0) {
        eVar17 = GRAVITY_ERROR_SEMANTIC;
      }
      else {
        iVar9 = string_cmp(*(char **)(pgVar12 + 1),"RUNTIME");
        if (iVar9 == 0) {
          eVar17 = GRAVITY_ERROR_RUNTIME;
        }
        else {
          iVar9 = string_cmp(*(char **)(pgVar12 + 1),"WARNING");
          eVar17 = (uint)(iVar9 == 0) * 5;
        }
      }
    }
  }
  uVar21 = 0xffffffff;
  uVar8 = 0xffffffff;
  if ((local_8e0 != (gnode_t *)0x0) && (local_8e0[1].tag == NODE_LABEL_STAT)) {
    uVar8 = local_8e0[1].block_length;
  }
  if ((pgVar20 != (gnode_t *)0x0) && (pgVar20[1].tag == NODE_LABEL_STAT)) {
    uVar21 = pgVar20[1].block_length;
  }
  if (local_8c0 == (gnode_t *)0x0) {
switchD_0011cd06_default:
    v.field_1.n = 0;
    v.isa = pgVar5;
    goto LAB_0011cd54;
  }
  switch(local_8c0[1].tag) {
  case NODE_LIST_STAT:
    v = gravity_string_to_value((gravity_vm *)0x0,*(char **)&local_8c0[1].block_length,0xffffffff);
    goto LAB_0011cd54;
  case NODE_COMPOUND_STAT:
    ppgVar14 = &gravity_class_float;
    break;
  case NODE_LABEL_STAT:
    ppgVar14 = &gravity_class_int;
    break;
  case NODE_FLOW_STAT:
    v.field_1.n._0_1_ = *(long *)&local_8c0[1].block_length != 0;
    v.isa = gravity_class_bool;
    v.field_1.n._1_7_ = 0;
    goto LAB_0011cd54;
  default:
    goto switchD_0011cd06_default;
  }
  v.field_1.n = *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)&local_8c0[1].block_length;
  v.isa = *ppgVar14;
LAB_0011cd54:
  pgVar2 = parser->delegate;
  if ((pgVar2 == (gravity_delegate_t *)0x0) ||
     (pgVar2->unittest_callback == (gravity_unittest_callback)0x0)) {
    gravity_value_free((gravity_vm *)0x0,v);
    pgVar12 = extraout_RAX_03;
  }
  else {
    pgVar12 = (gnode_t *)
              (*pgVar2->unittest_callback)
                        ((gravity_vm *)0x0,eVar17,local_8c8,(char *)local_8f8,v,uVar8,uVar21,
                         pgVar2->xdata);
  }
  ast_00 = local_8e0;
  ast = local_8e8;
  if (local_8d0 != (gnode_t *)0x0) {
    gnode_free(local_8d0);
    pgVar12 = extraout_RAX_04;
  }
  if (local_8f0 != (gnode_t *)0x0) {
    gnode_free(local_8f0);
    pgVar12 = extraout_RAX_05;
  }
  if (ast != (gnode_t *)0x0) {
    gnode_free(ast);
    pgVar12 = extraout_RAX_06;
  }
  if (ast_00 != (gnode_t *)0x0) {
    gnode_free(ast_00);
    pgVar12 = extraout_RAX_07;
  }
  if (pgVar20 != (gnode_t *)0x0) {
    gnode_free(pgVar20);
    pgVar12 = extraout_RAX_08;
  }
  if (local_8c0 == (gnode_t *)0x0) {
    return pgVar12;
  }
  gnode_free(local_8c0);
  return extraout_RAX_09;
}

Assistant:

static gnode_t *parse_macro_statement (gravity_parser_t *parser) {
    typedef enum {
        MACRO_UNKNOWN = 0,
        MACRO_UNITEST = 1,
        MACRO_INCLUDE = 2,
        MACRO_PUSH = 3,
        MACRO_POP = 4
    } builtin_macro;

    DEBUG_PARSER("parse_macro_statement");
    DECLARE_LEXER;

    // consume special # symbol
    gtoken_t type = gravity_lexer_next(lexer);
    assert(type == TOK_MACRO);

    // check for #! and interpret #! shebang bash as one line comment
    // only if found on first line
    if (gravity_lexer_peek(lexer) == TOK_OP_NOT && gravity_lexer_lineno(lexer) == 1) {
        // consume special ! symbol
        type = gravity_lexer_next(lexer);
        assert(type == TOK_OP_NOT);

        // skip until EOL
        gravity_lexer_skip_line(lexer);
        return NULL;
    }

    // macro has its own parser because I don't want to mess standard syntax
    const char *macroid = parse_identifier(parser);
    if (macroid == NULL) goto handle_error;

    // check macro
    builtin_macro macro_type = MACRO_UNKNOWN;
    if (string_cmp(macroid, "unittest") == 0) macro_type = MACRO_UNITEST;
    else if (string_cmp(macroid, "include") == 0) macro_type = MACRO_INCLUDE;
    else if (string_cmp(macroid, "push") == 0) macro_type = MACRO_PUSH;
    else if (string_cmp(macroid, "pop") == 0) macro_type = MACRO_POP;
    mem_free(macroid);

    gtoken_s token = gravity_lexer_token(lexer);
    token.type = TOK_MACRO;
    PARSER_CALL_CALLBACK(token);

    switch (macro_type) {
        case MACRO_UNITEST:
            return parse_unittest_macro(parser);
            break;

        case MACRO_INCLUDE:
            return parse_include_macro(parser);
            break;

        case MACRO_PUSH:
            break;

        case MACRO_POP:
            break;

        case MACRO_UNKNOWN:
            break;
    }

handle_error:
    REPORT_WARNING(gravity_lexer_token(lexer), "%s", "Unknown macro token. Declaration will be ignored.");
    return NULL;
}